

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

uint __thiscall
ON_SubDFace::GetEdgeArray(ON_SubDFace *this,ON_SimpleArray<ON_SubDEdgePtr> *face_edge_array)

{
  ushort uVar1;
  int iVar2;
  uint count;
  ulong newcap;
  bool bVar3;
  
  if (-1 < face_edge_array->m_capacity) {
    face_edge_array->m_count = 0;
  }
  uVar1 = this->m_edge_count;
  newcap = (ulong)uVar1;
  ON_SimpleArray<ON_SubDEdgePtr>::Reserve(face_edge_array,newcap);
  count = 4;
  if (newcap < 5) {
    count = (uint)uVar1;
  }
  ON_SimpleArray<ON_SubDEdgePtr>::Append(face_edge_array,count,this->m_edge4);
  if (4 < newcap) {
    if (this->m_edgex == (ON_SubDEdgePtr *)0x0) {
      iVar2 = uVar1 - 4;
      while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
        ON_SimpleArray<ON_SubDEdgePtr>::Append(face_edge_array,&ON_SubDEdgePtr::Null);
      }
    }
    else {
      ON_SimpleArray<ON_SubDEdgePtr>::Append(face_edge_array,uVar1 - 4,this->m_edgex);
    }
  }
  return (uint)uVar1;
}

Assistant:

unsigned int ON_SubDFace::GetEdgeArray(
  ON_SimpleArray< ON_SubDEdgePtr >& face_edge_array
) const
{
  face_edge_array.SetCount(0);
  const unsigned edge_count = m_edge_count;
  face_edge_array.Reserve(edge_count);
  face_edge_array.Append(edge_count <= 4 ? edge_count : 4U, m_edge4);
  if (edge_count > 4)
  {
    if ( nullptr != m_edgex )
     face_edge_array.Append(edge_count-4U, m_edgex);
    else
    {
      for (unsigned fei = 4; fei < edge_count; ++fei)
        face_edge_array.Append(ON_SubDEdgePtr::Null);
    }
  }
  return edge_count;
}